

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
          (InterInvocationTestCase *this,Context *context,char *name,char *desc,StorageType storage,
          int flags)

{
  int flags_local;
  StorageType storage_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  InterInvocationTestCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InterInvocationTestCase_032b3fa0;
  this->m_storage = storage;
  this->m_useAtomic = (flags & 1U) != 0;
  this->m_aliasingStorages = (flags & 2U) != 0;
  this->m_syncWithGroup = (flags & 4U) != 0;
  this->m_workWidth = 0x100;
  this->m_workHeight = 0x100;
  this->m_localWidth = 0x10;
  this->m_localHeight = 8;
  this->m_elementsPerInvocation = 8;
  this->m_storageBuf = 0;
  this->m_storageTex = 0;
  this->m_resultBuf = 0;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

InterInvocationTestCase::InterInvocationTestCase (Context& context, const char* name, const char* desc, StorageType storage, int flags)
	: TestCase					(context, name, desc)
	, m_storage					(storage)
	, m_useAtomic				((flags & FLAG_ATOMIC) != 0)
	, m_aliasingStorages		((flags & FLAG_ALIASING_STORAGES) != 0)
	, m_syncWithGroup			((flags & FLAG_IN_GROUP) != 0)
	, m_workWidth				(256)
	, m_workHeight				(256)
	, m_localWidth				(16)
	, m_localHeight				(8)
	, m_elementsPerInvocation	(8)
	, m_storageBuf				(0)
	, m_storageTex				(0)
	, m_resultBuf				(0)
	, m_program					(DE_NULL)
{
	DE_ASSERT(m_storage < STORAGE_LAST);
	DE_ASSERT(m_localWidth*m_localHeight <= 128); // minimum MAX_COMPUTE_WORK_GROUP_INVOCATIONS value
}